

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O0

JavascriptString *
Js::JavascriptString::PadCore
          (ArgumentReader *args,JavascriptString *mainString,bool isPadStart,
          ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  charcount_t cVar3;
  BOOL BVar4;
  charcount_t cVar5;
  uint count_00;
  undefined4 *puVar6;
  Var pvVar7;
  int64 iVar8;
  JavascriptLibrary *this;
  JavascriptString *pstRight;
  JavascriptString *local_78;
  JavascriptString *local_60;
  JavascriptString *finalPad;
  charcount_t count;
  charcount_t fillLength;
  JavascriptString *argStr;
  JavascriptString *fillerString;
  charcount_t currentLength;
  int64 maxLength;
  ScriptContext *scriptContext_local;
  bool isPadStart_local;
  JavascriptString *mainString_local;
  ArgumentReader *args_local;
  
  if (mainString == (JavascriptString *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0x85d,"(mainString != nullptr)","mainString != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  if (((ulong)(args->super_Arguments).Info & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0x85e,"(args.Info.Count > 0)","args.Info.Count > 0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  args_local = (ArgumentReader *)mainString;
  if ((SUB84((args->super_Arguments).Info,0) & 0xffffff) != 1) {
    pvVar7 = Arguments::operator[](&args->super_Arguments,1);
    iVar8 = JavascriptConversion::ToLength(pvVar7,scriptContext);
    cVar3 = GetLength(mainString);
    if ((long)(ulong)cVar3 < iVar8) {
      argStr = (JavascriptString *)0x0;
      if (2 < (SUB84((args->super_Arguments).Info,0) & 0xffffff)) {
        pvVar7 = Arguments::operator[](&args->super_Arguments,2);
        BVar4 = Js::JavascriptOperators::IsUndefinedObject(pvVar7);
        if (BVar4 == 0) {
          pvVar7 = Arguments::operator[](&args->super_Arguments,2);
          argStr = JavascriptConversion::ToString(pvVar7,scriptContext);
          cVar5 = GetLength(argStr);
          if (cVar5 == 0) {
            return mainString;
          }
        }
      }
      if (0x7ffffffe < iVar8) {
        JavascriptError::ThrowRangeError(scriptContext,-0x7ff5e9da,(PCWSTR)0x0);
      }
      if (argStr == (JavascriptString *)0x0) {
        argStr = NewWithBuffer(L" ",1,scriptContext);
      }
      cVar5 = GetLength(argStr);
      if (cVar5 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                    ,0x884,"(fillerString->GetLength() > 0)",
                                    "fillerString->GetLength() > 0");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      finalPad._4_4_ = (int)iVar8 - cVar3;
      cVar3 = GetLength(argStr);
      count_00 = finalPad._4_4_ / cVar3;
      this = ScriptContext::GetLibrary(scriptContext);
      local_60 = JavascriptLibrary::GetEmptyString(this);
      if (count_00 != 0) {
        local_60 = RepeatCore(argStr,count_00,scriptContext);
        cVar3 = GetLength(argStr);
        finalPad._4_4_ = finalPad._4_4_ - count_00 * cVar3;
      }
      if (finalPad._4_4_ != 0) {
        pstRight = SubString::New(argStr,0,finalPad._4_4_);
        local_60 = Concat(local_60,pstRight);
      }
      if (isPadStart) {
        local_78 = Concat(local_60,mainString);
      }
      else {
        local_78 = Concat(mainString,local_60);
      }
      args_local = (ArgumentReader *)local_78;
    }
  }
  return (JavascriptString *)args_local;
}

Assistant:

JavascriptString* JavascriptString::PadCore(ArgumentReader& args, JavascriptString *mainString, bool isPadStart, ScriptContext* scriptContext)
    {
        Assert(mainString != nullptr);
        Assert(args.Info.Count > 0);

        if (args.Info.Count == 1)
        {
            return mainString;
        }

        int64 maxLength = JavascriptConversion::ToLength(args[1], scriptContext);
        charcount_t currentLength = mainString->GetLength();
        if (maxLength <= currentLength)
        {
            return mainString;
        }

        JavascriptString * fillerString = nullptr;
        if (args.Info.Count > 2 && !JavascriptOperators::IsUndefinedObject(args[2]))
        {
            JavascriptString *argStr = JavascriptConversion::ToString(args[2], scriptContext);
            if (argStr->GetLength() > 0)
            {
                fillerString = argStr;
            }
            else
            {
                return mainString;
            }
        }

        if (maxLength > JavascriptString::MaxCharLength)
        {
            JavascriptError::ThrowRangeError(scriptContext, JSERR_OutOfBoundString);
        }

        if (fillerString == nullptr)
        {
            fillerString = NewWithBuffer(_u(" "), 1, scriptContext);
        }

        Assert(fillerString->GetLength() > 0);

        charcount_t fillLength = (charcount_t)(maxLength - currentLength);
        charcount_t count = fillLength / fillerString->GetLength();
        JavascriptString * finalPad = scriptContext->GetLibrary()->GetEmptyString();
        if (count > 0)
        {
            finalPad = RepeatCore(fillerString, count, scriptContext);
            fillLength -= (count * fillerString->GetLength());
        }

        if (fillLength > 0)
        {
            finalPad = Concat(finalPad, SubString::New(fillerString, 0, fillLength));
        }

        return isPadStart ? Concat(finalPad, mainString) : Concat(mainString, finalPad);
    }